

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::clearFile(FileServer *this,TURI *uri)

{
  bool bVar1;
  size_type sVar2;
  pointer pIVar3;
  int i;
  lock_guard<std::mutex> lock;
  FileData *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  FileData *this_00;
  size_type in_stack_ffffffffffffff18;
  string *psVar4;
  string *psVar5;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff40;
  int iVar6;
  allocator local_aa;
  allocator local_a9;
  string local_a8 [80];
  undefined1 auStack_58 [40];
  reference local_30;
  int local_1c;
  
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x135be9);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff00,
             (mutex_type *)in_stack_fffffffffffffef8);
  local_1c = 0;
  do {
    iVar6 = local_1c;
    std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
    operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                *)0x135c20);
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(iVar6,in_stack_ffffffffffffff40));
    if ((int)sVar2 <= iVar6) {
LAB_00135e2e:
      pIVar3 = std::
               unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
               ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                             *)0x135e38);
      pIVar3->changedFileInfos = true;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x135e49);
      return true;
    }
    pIVar3 = std::
             unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
             operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x135c45);
    std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>::
    operator[](&pIVar3->files,(long)local_1c);
    bVar1 = std::operator!=(in_stack_ffffffffffffff00,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffef8);
    if (!bVar1) {
      std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
      operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                  *)0x135c7e);
      local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::_Bit_reference::operator=(&local_30,false);
      psVar4 = local_a8;
      psVar5 = psVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(psVar5,"?",&local_a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      psVar5 = psVar4;
      *(undefined8 *)(psVar4 + 0x20) = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(psVar4 + 0x28,"?",&local_aa);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa);
      *(undefined4 *)(psVar5 + 0x48) = 0;
      this_00 = (FileData *)auStack_58;
      memset(this_00,0,0x18);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)0x135d7e);
      pIVar3 = std::
               unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
               ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                             *)0x135d88);
      std::vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>::
      operator[](&pIVar3->files,(long)local_1c);
      FileData::operator=(this_00,in_stack_fffffffffffffef8);
      FileData::~FileData(this_00);
      goto LAB_00135e2e;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool FileServer::clearFile(const TURI & uri) {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        for (int i = 0; i < (int) m_impl->fileUsed.size(); ++i) {
            if (m_impl->files[i].info.uri != uri) {
                continue;
            }
            m_impl->fileUsed[i] = false;
            m_impl->files[i] = {};

            break;
        }

        m_impl->changedFileInfos = true;
    }

    return true;
}